

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O3

StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::util::converter::DataPiece::ToBytes_abi_cxx11_
          (StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,DataPiece *this)

{
  char *pcVar1;
  long lVar2;
  StringPiece error_message;
  StringPiece error_message_00;
  bool bVar3;
  undefined8 uVar4;
  size_type *psVar5;
  StringPiece src;
  StringPiece default_string;
  StringPiece default_string_00;
  string local_98;
  undefined1 local_78 [8];
  string decoded;
  undefined1 *local_50;
  
  if (this->type_ == TYPE_STRING) {
    psVar5 = &decoded._M_string_length;
    decoded._M_dataplus._M_p = (pointer)0x0;
    decoded._M_string_length._0_1_ = 0;
    lVar2 = (this->field_2).str_.size_;
    local_78 = (undefined1  [8])psVar5;
    if (lVar2 < 0) {
      __assert_fail("len >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/stringpiece.h"
                    ,0xe6,
                    "google::protobuf::StringPiece::StringPiece(const char *, stringpiece_ssize_type)"
                   );
    }
    src.length_ = lVar2;
    src.ptr_ = (char *)(this->field_2).i64_;
    bVar3 = DecodeBase64(this,src,(string *)local_78);
    if (bVar3) {
      Status::Status(&__return_storage_ptr__->status_);
      (__return_storage_ptr__->value_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->value_).field_2;
      (__return_storage_ptr__->value_)._M_string_length = 0;
      (__return_storage_ptr__->value_).field_2._M_local_buf[0] = '\0';
      Status::operator=(&__return_storage_ptr__->status_,(Status *)Status::OK);
      std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->value_);
      uVar4 = local_78;
    }
    else {
      default_string_00.length_ = 0x16;
      default_string_00.ptr_ = "Invalid data in input.";
      ValueAsStringOrDefault_abi_cxx11_(&local_98,this,default_string_00);
      error_message.length_ = local_98._M_string_length;
      error_message.ptr_ = local_98._M_dataplus._M_p;
      if ((long)local_98._M_string_length < 0) {
        StringPiece::LogFatalSizeTooBig(local_98._M_string_length,"size_t to int conversion");
      }
      Status::Status((Status *)((long)&decoded.field_2 + 8),INVALID_ARGUMENT,error_message);
      StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      StatusOr(__return_storage_ptr__,(Status *)((long)&decoded.field_2 + 8));
      if (local_50 != &stack0xffffffffffffffc0) {
        operator_delete(local_50);
      }
      uVar4 = local_78;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
        uVar4 = local_78;
      }
    }
  }
  else {
    if (this->type_ != TYPE_BYTES) {
      default_string.length_ = 0x3b;
      default_string.ptr_ = "Wrong type. Only String or Bytes can be converted to Bytes.";
      ValueAsStringOrDefault_abi_cxx11_((string *)local_78,this,default_string);
      error_message_00.length_ = (stringpiece_ssize_type)decoded._M_dataplus._M_p;
      error_message_00.ptr_ = (char *)local_78;
      if ((long)decoded._M_dataplus._M_p < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)decoded._M_dataplus._M_p,"size_t to int conversion")
        ;
      }
      Status::Status((Status *)((long)&decoded.field_2 + 8),INVALID_ARGUMENT,error_message_00);
      StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      StatusOr(__return_storage_ptr__,(Status *)((long)&decoded.field_2 + 8));
      if (local_50 != &stack0xffffffffffffffc0) {
        operator_delete(local_50);
      }
      uVar4 = local_78;
      if (local_78 == (undefined1  [8])&decoded._M_string_length) {
        return __return_storage_ptr__;
      }
      goto LAB_0030242f;
    }
    pcVar1 = (this->field_2).str_.data_;
    psVar5 = (size_type *)&stack0xffffffffffffffb8;
    decoded.field_2._8_8_ = psVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&decoded.field_2 + 8),pcVar1,pcVar1 + (this->field_2).str_.size_);
    Status::Status(&__return_storage_ptr__->status_);
    (__return_storage_ptr__->value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value_).field_2;
    (__return_storage_ptr__->value_)._M_string_length = 0;
    (__return_storage_ptr__->value_).field_2._M_local_buf[0] = '\0';
    Status::operator=(&__return_storage_ptr__->status_,(Status *)Status::OK);
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->value_);
    uVar4 = decoded.field_2._8_8_;
  }
  if ((size_type *)uVar4 == psVar5) {
    return __return_storage_ptr__;
  }
LAB_0030242f:
  operator_delete((void *)uVar4);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::string> DataPiece::ToBytes() const {
  if (type_ == TYPE_BYTES) return str_.ToString();
  if (type_ == TYPE_STRING) {
    std::string decoded;
    if (!DecodeBase64(str_, &decoded)) {
      return InvalidArgument(ValueAsStringOrDefault("Invalid data in input."));
    }
    return decoded;
  } else {
    return InvalidArgument(ValueAsStringOrDefault(
        "Wrong type. Only String or Bytes can be converted to Bytes."));
  }
}